

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

int LogL10fromY(double Y,int em)

{
  int iVar1;
  double dVar2;
  
  iVar1 = 0x3ff;
  if ((Y < 15.742) && (iVar1 = 0, 0.00024283 < Y)) {
    dVar2 = log(Y);
    iVar1 = tiff_itrunc((dVar2 * 1.4426950408889634 + 12.0) * 64.0,em);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int
    LogL10fromY(double Y, int em) /* get 10-bit LogL from Y */
{
    if (Y >= 15.742)
        return (0x3ff);
    else if (Y <= .00024283)
        return (0);
    else
        return tiff_itrunc(64. * (log2(Y) + 12.), em);
}